

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count.cpp
# Opt level: O2

void __thiscall Count::Count(Count *this,shared_ptr<Launcher> *launcher)

{
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._features.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->super_Application)._features.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->super_Application)._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->countQuery = (Query *)0x0;
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__Count_0021ec30;
  (this->_pathToFiles)._M_dataplus._M_p = (pointer)&(this->_pathToFiles).field_2;
  (this->_pathToFiles)._M_string_length = 0;
  (this->_pathToFiles).field_2._M_local_buf[0] = '\0';
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Launcher::getCompiler((Launcher *)&stack0xffffffffffffffd8);
  std::__shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  Launcher::getTreeDecomposition((Launcher *)&stack0xffffffffffffffd8);
  std::__shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

Count::Count(shared_ptr<Launcher> launcher) 
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();
}